

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O0

void squall::detail::push_aux<Foo>(HSQUIRRELVM vm,Foo *v)

{
  HSQOBJECT obj;
  bool bVar1;
  KlassTable *this;
  SQUserPointer unaff_RBP;
  SQObjectValue unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  HSQUIRRELVM v_00;
  HSQOBJECT sqo;
  Foo *v_local;
  HSQUIRRELVM vm_local;
  
  this = klass_table(vm);
  bVar1 = KlassTable::find_klass_object<Foo>(this,(HSQOBJECT *)&stack0xffffffffffffffd8);
  if (bVar1) {
    obj._unVal.pTable = unaff_retaddr.pTable;
    obj._0_8_ = unaff_RBP;
    v_00 = in_stack_ffffffffffffffd8;
    sq_pushobject(vm,obj);
    sq_createinstance(in_stack_00000008,unaff_retaddr.nInteger);
    sq_setinstanceup(v_00,sqo._0_8_,in_stack_ffffffffffffffd8);
    sq_remove((HSQUIRRELVM)sqo._0_8_,(SQInteger)in_stack_ffffffffffffffd8);
  }
  else {
    sq_pushuserpointer((HSQUIRRELVM)unaff_retaddr.pTable,unaff_RBP);
  }
  return;
}

Assistant:

inline
void push_aux(HSQUIRRELVM vm, T* v) {
    HSQOBJECT sqo;
    if (klass_table(vm).find_klass_object<T>(sqo)) {
        sq_pushobject(vm, sqo);
        sq_createinstance(vm, -1);
        sq_setinstanceup(vm, -1, v);
        sq_remove(vm, -2);
    } else {
        sq_pushuserpointer(vm, v);
    }
}